

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O3

sexp sexp_exact_sqrt(sexp ctx,sexp self,sexp_sint_t n,sexp z)

{
  sexp a;
  double f;
  sexp rem;
  sexp local_48;
  sexp local_40;
  sexp_gc_var_t local_38;
  sexp_gc_var_t local_28;
  
  local_38.var = &local_48;
  local_48 = (sexp)0x43e;
  local_28.var = &local_40;
  local_40 = (sexp)&DAT_0000043e;
  local_28.next = &local_38;
  local_38.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_28;
  if ((((ulong)z & 3) == 0) && (z->tag == 0xc)) {
    local_38.var = &local_48;
    local_48 = sexp_bignum_sqrt(ctx,z,&local_40);
  }
  else {
    local_48 = sexp_inexact_sqrt(ctx,self,(sexp_sint_t)local_28.var,z);
    if ((((ulong)local_48 & 3) == 0) && (local_48->tag == 0xb)) {
      f = trunc((local_48->value).flonum);
      a = sexp_double_to_bignum(ctx,f);
      local_48 = sexp_bignum_normalize(a);
    }
    if ((((ulong)local_48 & 3) == 0) && (local_48->tag == 0x13)) goto LAB_0012933c;
    local_40 = sexp_mul(ctx,local_48,local_48);
    local_40 = sexp_sub(ctx,z,local_40);
    if (((ulong)local_40 & 1) == 0) {
      if (((((ulong)local_40 & 2) != 0) || (local_40->tag != 0xc)) ||
         (-1 < (local_40->value).flonum_bits[0])) {
LAB_001292d7:
        if (((((ulong)local_40 & 3) != 0) || (local_40->tag != 0xb)) ||
           (0.0 < (local_40->value).flonum || (local_40->value).flonum == 0.0)) goto LAB_00129337;
      }
    }
    else if (-1 < (long)local_40) goto LAB_001292d7;
    local_48 = sexp_sub(ctx,local_48,(sexp)&DAT_00000003);
    local_40 = sexp_mul(ctx,local_48,local_48);
    local_40 = sexp_sub(ctx,z,local_40);
  }
LAB_00129337:
  local_48 = sexp_cons_op(ctx,(sexp)0x0,2,local_48,local_40);
LAB_0012933c:
  (ctx->value).context.saves = local_38.next;
  return local_48;
}

Assistant:

sexp sexp_exact_sqrt (sexp ctx, sexp self, sexp_sint_t n, sexp z) {
  sexp_gc_var2(res, rem);
  sexp_gc_preserve2(ctx, res, rem);
  if (sexp_bignump(z)) {
    res = sexp_bignum_sqrt(ctx, z, &rem);
    res = sexp_cons(ctx, res, rem);
  } else {
    res = sexp_inexact_sqrt(ctx, self, n, z);
    if (sexp_flonump(res)) {
      res = sexp_bignum_normalize(sexp_double_to_bignum(ctx, trunc(sexp_flonum_value(res))));
    }
    if (!sexp_exceptionp(res)) {
      rem = sexp_mul(ctx, res, res);
      rem = sexp_sub(ctx, z, rem);
      if (sexp_negativep(rem)) {
        res = sexp_sub(ctx, res, SEXP_ONE);
        rem = sexp_mul(ctx, res, res);
        rem = sexp_sub(ctx, z, rem);
      }
      res = sexp_cons(ctx, res, rem);
    }
  }
  sexp_gc_release2(ctx);
  return res;
}